

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O3

cmFileLockResult __thiscall cmFileLock::LockWithoutTimeout(cmFileLock *this)

{
  int iVar1;
  cmFileLockResult cVar2;
  
  iVar1 = fcntl64(this->File,7);
  if (iVar1 == -1) {
    cVar2 = cmFileLockResult::MakeSystem();
  }
  else {
    cVar2 = cmFileLockResult::MakeOk();
  }
  return cVar2;
}

Assistant:

cmFileLockResult cmFileLock::LockWithoutTimeout()
{
  if (this->LockFile(F_SETLKW, F_WRLCK) == -1) {
    return cmFileLockResult::MakeSystem();
  }
  return cmFileLockResult::MakeOk();
}